

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O2

HFactor * __thiscall HFactor::operator=(HFactor *this,HFactor *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  undefined4 uVar6;
  HighsInt HVar7;
  bool bVar8;
  undefined2 uVar9;
  long lVar10;
  HighsInt *pHVar11;
  HighsInt *pHVar12;
  byte bVar13;
  
  bVar13 = 0;
  this->rank_deficiency = param_1->rank_deficiency;
  uVar1 = *(undefined4 *)((long)&param_1->build_realTick + 4);
  uVar2 = *(undefined4 *)&param_1->build_synthetic_tick;
  uVar3 = *(undefined4 *)((long)&param_1->build_synthetic_tick + 4);
  *(undefined4 *)&this->build_realTick = *(undefined4 *)&param_1->build_realTick;
  *(undefined4 *)((long)&this->build_realTick + 4) = uVar1;
  *(undefined4 *)&this->build_synthetic_tick = uVar2;
  *(undefined4 *)((long)&this->build_synthetic_tick + 4) = uVar3;
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_with_no_pivot,&param_1->row_with_no_pivot);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_with_no_pivot,&param_1->col_with_no_pivot);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->var_with_no_pivot,&param_1->var_with_no_pivot);
  RefactorInfo::operator=(&this->refactor_info_,&param_1->refactor_info_);
  pHVar11 = &param_1->basis_matrix_num_el;
  pHVar12 = &this->basis_matrix_num_el;
  for (lVar10 = 0xe; lVar10 != 0; lVar10 = lVar10 + -1) {
    *(undefined8 *)pHVar12 = *(undefined8 *)pHVar11;
    pHVar11 = pHVar11 + (ulong)bVar13 * -4 + 2;
    pHVar12 = pHVar12 + (ulong)bVar13 * -4 + 2;
  }
  std::__uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>::operator=
            ((__uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
             &this->log_data,
             (__uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_> *)
             &param_1->log_data);
  HighsLogOptions::operator=(&this->log_options,&param_1->log_options);
  bVar8 = param_1->debug_report_;
  uVar9 = *(undefined2 *)&param_1->field_0x192;
  HVar4 = param_1->basis_matrix_limit_size;
  HVar5 = param_1->update_method;
  uVar1 = *(undefined4 *)&param_1->field_0x19c;
  uVar2 = *(undefined4 *)&param_1->field_0x19c;
  uVar3 = *(undefined4 *)&param_1->build_timer_;
  uVar6 = *(undefined4 *)((long)&param_1->build_timer_ + 4);
  HVar7 = param_1->nwork;
  this->use_original_HFactor_logic = param_1->use_original_HFactor_logic;
  this->debug_report_ = bVar8;
  *(undefined2 *)&this->field_0x192 = uVar9;
  this->basis_matrix_limit_size = HVar4;
  this->update_method = HVar5;
  *(undefined4 *)&this->field_0x19c = uVar1;
  *(undefined4 *)&this->field_0x19c = uVar2;
  *(undefined4 *)&this->build_timer_ = uVar3;
  *(undefined4 *)((long)&this->build_timer_ + 4) = uVar6;
  this->nwork = HVar7;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->iwork,&param_1->iwork);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->dwork,&param_1->dwork);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->b_var,&param_1->b_var);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->b_start,&param_1->b_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->b_index,&param_1->b_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->b_value,&param_1->b_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->permute,&param_1->permute);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_var,&param_1->mc_var);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_start,&param_1->mc_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_count_a,&param_1->mc_count_a);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_count_n,&param_1->mc_count_n);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_space,&param_1->mc_space);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mc_index,&param_1->mc_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->mc_value,&param_1->mc_value);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->mc_min_pivot,&param_1->mc_min_pivot);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_start,&param_1->mr_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_count,&param_1->mr_count);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_space,&param_1->mr_space);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->mr_count_before,&param_1->mr_count_before);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->mr_index,&param_1->mr_index);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->mwz_column_index,&param_1->mwz_column_index);
  std::vector<char,_std::allocator<char>_>::_M_move_assign
            (&this->mwz_column_mark,&param_1->mwz_column_mark);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->mwz_column_array,&param_1->mwz_column_array);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_link_first,&param_1->col_link_first);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_link_next,&param_1->col_link_next);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->col_link_last,&param_1->col_link_last);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_link_first,&param_1->row_link_first);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_link_next,&param_1->row_link_next);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->row_link_last,&param_1->row_link_last);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->l_pivot_lookup,&param_1->l_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->l_pivot_index,&param_1->l_pivot_index);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->l_start,&param_1->l_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->l_index,&param_1->l_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->l_value,&param_1->l_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->lr_start,&param_1->lr_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->lr_index,&param_1->lr_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->lr_value,&param_1->lr_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->u_pivot_lookup,&param_1->u_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->u_pivot_index,&param_1->u_pivot_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->u_pivot_value,&param_1->u_pivot_value);
  HVar4 = param_1->u_total_x;
  this->u_merit_x = param_1->u_merit_x;
  this->u_total_x = HVar4;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->u_start,&param_1->u_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->u_last_p,&param_1->u_last_p);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->u_index,&param_1->u_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->u_value,&param_1->u_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_start,&param_1->ur_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_lastp,&param_1->ur_lastp);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_space,&param_1->ur_space);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ur_index,&param_1->ur_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->ur_value,&param_1->ur_value);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&this->pf_pivot_value,&param_1->pf_pivot_value);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->pf_pivot_index,&param_1->pf_pivot_index);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->pf_start,&param_1->pf_start);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->pf_index,&param_1->pf_index);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->pf_value,&param_1->pf_value);
  HVectorBase<double>::operator=(&this->rhs_,&param_1->rhs_);
  return this;
}

Assistant:

HFactor()
      : build_realTick(0.0),
        build_synthetic_tick(0.0),
        rank_deficiency(0),
        basis_matrix_num_el(0),
        invert_num_el(0),
        kernel_dim(0),
        kernel_num_el(0),
        num_row(0),
        num_col(0),
        num_basic(0),
        a_matrix_valid(false),
        a_start(nullptr),
        a_index(nullptr),
        a_value(nullptr),
        basic_index(nullptr),
        pivot_threshold(0.0),
        pivot_tolerance(0.0),
        highs_debug_level(0),
        time_limit_(0.0),
        use_original_HFactor_logic(false),
        debug_report_(false),
        basis_matrix_limit_size(0),
        update_method(0),
        build_timer_(nullptr),
        nwork(0),
        u_merit_x(0),
        // clang-format off
        u_total_x(0) {}